

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Own<const_kj::Executor,_std::nullptr_t> __thiscall kj::_::ExecutorImpl::addRef(ExecutorImpl *this)

{
  uint *puVar1;
  Executor *in_RDX;
  Disposer *in_RDI;
  Own<const_kj::Executor,_std::nullptr_t> OVar2;
  
  LOCK();
  puVar1 = &(this->super_AtomicRefcounted).refcount;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  in_RDI->_vptr_Disposer = (_func_int **)&this->super_AtomicRefcounted;
  in_RDI[1]._vptr_Disposer = (_func_int **)this;
  OVar2.ptr = in_RDX;
  OVar2.disposer = in_RDI;
  return OVar2;
}

Assistant:

kj::Own<const Executor> addRef() const override {
    return kj::atomicAddRef(*this);
  }